

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
CivetServer::getListeningPorts
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,CivetServer *this)

{
  pointer piVar1;
  long lVar2;
  int *piVar3;
  long lVar4;
  vector<mg_server_port,_std::allocator<mg_server_port>_> server_ports;
  allocator_type local_29;
  vector<mg_server_port,_std::allocator<mg_server_port>_> local_28;
  
  getListeningPortsFull(&local_28,this);
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,
             (long)local_28.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_28.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 5,&local_29);
  if ((long)local_28.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_28.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>._M_impl.
            super__Vector_impl_data._M_start == 0) {
    if (local_28.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return __return_storage_ptr__;
    }
  }
  else {
    lVar2 = (long)local_28.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_28.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 5;
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar3 = &(local_28.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>._M_impl.
               super__Vector_impl_data._M_start)->port;
    lVar4 = 0;
    do {
      piVar1[lVar4] = *piVar3;
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 8;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar4);
  }
  operator_delete(local_28.super__Vector_base<mg_server_port,_std::allocator<mg_server_port>_>.
                  _M_impl.super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int>
CivetServer::getListeningPorts()
{
	std::vector<struct mg_server_port> server_ports = getListeningPortsFull();

	std::vector<int> ports(server_ports.size());
	for (size_t i = 0; i < server_ports.size(); i++) {
		ports[i] = server_ports[i].port;
	}

	return ports;
}